

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12config.c
# Opt level: O0

int aom_copy_metadata_to_frame_buffer(YV12_BUFFER_CONFIG *ybf,aom_metadata_array_t *arr)

{
  aom_metadata_array_t *paVar1;
  aom_metadata_t *paVar2;
  undefined8 *in_RSI;
  uint8_t *in_RDI;
  size_t i;
  size_t in_stack_ffffffffffffffd8;
  uint32_t in_stack_fffffffffffffffc;
  int iVar3;
  
  if (((in_RDI == (uint8_t *)0x0) || (in_RSI == (undefined8 *)0x0)) || (in_RSI[1] == 0)) {
    iVar3 = -1;
  }
  else if (*(undefined8 **)(in_RDI + 200) == in_RSI) {
    iVar3 = 0;
  }
  else {
    aom_remove_metadata_from_frame_buffer((YV12_BUFFER_CONFIG *)0x6adf61);
    paVar1 = aom_img_metadata_array_alloc(in_stack_ffffffffffffffd8);
    *(aom_metadata_array_t **)(in_RDI + 200) = paVar1;
    if (*(long *)(in_RDI + 200) == 0) {
      iVar3 = -1;
    }
    else {
      for (paVar1 = (aom_metadata_array_t *)0x0;
          paVar1 < (aom_metadata_array_t *)**(ulong **)(in_RDI + 200);
          paVar1 = (aom_metadata_array_t *)((long)&paVar1->sz + 1)) {
        paVar2 = aom_img_metadata_alloc
                           (in_stack_fffffffffffffffc,in_RDI,(size_t)in_RSI,
                            (aom_metadata_insert_flags_t)((ulong)paVar1 >> 0x20));
        *(aom_metadata_t **)(*(long *)(*(long *)(in_RDI + 200) + 8) + (long)paVar1 * 8) = paVar2;
        if (*(long *)(*(long *)(*(long *)(in_RDI + 200) + 8) + (long)paVar1 * 8) == 0) {
          aom_img_metadata_array_free(paVar1);
          in_RDI[200] = '\0';
          in_RDI[0xc9] = '\0';
          in_RDI[0xca] = '\0';
          in_RDI[0xcb] = '\0';
          in_RDI[0xcc] = '\0';
          in_RDI[0xcd] = '\0';
          in_RDI[0xce] = '\0';
          in_RDI[0xcf] = '\0';
          return -1;
        }
      }
      **(undefined8 **)(in_RDI + 200) = *in_RSI;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int aom_copy_metadata_to_frame_buffer(YV12_BUFFER_CONFIG *ybf,
                                      const aom_metadata_array_t *arr) {
  if (!ybf || !arr || !arr->metadata_array) return -1;
  if (ybf->metadata == arr) return 0;
  aom_remove_metadata_from_frame_buffer(ybf);
  ybf->metadata = aom_img_metadata_array_alloc(arr->sz);
  if (!ybf->metadata) return -1;
  for (size_t i = 0; i < ybf->metadata->sz; i++) {
    ybf->metadata->metadata_array[i] = aom_img_metadata_alloc(
        arr->metadata_array[i]->type, arr->metadata_array[i]->payload,
        arr->metadata_array[i]->sz, arr->metadata_array[i]->insert_flag);
    if (ybf->metadata->metadata_array[i] == NULL) {
      aom_img_metadata_array_free(ybf->metadata);
      ybf->metadata = NULL;
      return -1;
    }
  }
  ybf->metadata->sz = arr->sz;
  return 0;
}